

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

SectionTracker * Catch::TestCaseTracking::SectionTracker::acquire(TrackerContext *ctx,string *name)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  TrackerBase *name_00;
  int __oflag;
  Ptr<Catch::TestCaseTracking::ITracker> *in_RSI;
  pointer_____offset_0x10___ *this;
  TrackerContext *in_RDI;
  ITracker *childTracker;
  ITracker *currentTracker;
  SectionTracker *section;
  ITracker *in_stack_ffffffffffffff98;
  ITracker *pIVar4;
  TrackerContext *in_stack_ffffffffffffffa0;
  Ptr<Catch::TestCaseTracking::ITracker> *this_00;
  SectionTracker *in_stack_ffffffffffffffb0;
  Ptr<Catch::TestCaseTracking::ITracker> local_40 [3];
  long local_28;
  ITracker *local_20;
  TrackerBase *local_18;
  Ptr<Catch::TestCaseTracking::ITracker> *local_10;
  TrackerContext *local_8;
  
  local_18 = (TrackerBase *)0x0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = TrackerContext::currentTracker(in_RDI);
  iVar2 = (*(local_20->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
            _vptr_NonCopyable[0xe])();
  local_28 = CONCAT44(extraout_var,iVar2);
  if (local_28 == 0) {
    name_00 = (TrackerBase *)operator_new(0x60);
    SectionTracker(in_stack_ffffffffffffffb0,(string *)name_00,in_stack_ffffffffffffffa0,
                   in_stack_ffffffffffffff98);
    this = (pointer_____offset_0x10___ *)local_40;
    pIVar4 = local_20;
    local_18 = name_00;
    Ptr<Catch::TestCaseTracking::ITracker>::Ptr
              ((Ptr<Catch::TestCaseTracking::ITracker> *)this,local_20);
    this_00 = (Ptr<Catch::TestCaseTracking::ITracker> *)this;
    (*(pIVar4->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable
      [0xd])();
    Ptr<Catch::TestCaseTracking::ITracker>::~Ptr(this_00);
  }
  else if (local_28 == 0) {
    local_18 = (TrackerBase *)0x0;
    this = (pointer_____offset_0x10___ *)local_10;
  }
  else {
    this = &ITracker::typeinfo;
    local_18 = (TrackerBase *)__dynamic_cast(local_28,&ITracker::typeinfo,&typeinfo,0);
  }
  bVar1 = TrackerContext::completedCycle(local_8);
  if ((!bVar1) &&
     (uVar3 = (*(local_18->super_ITracker).super_SharedImpl<Catch::IShared>.super_IShared.
                super_NonCopyable._vptr_NonCopyable[5])(), (uVar3 & 1) == 0)) {
    TrackerBase::open(local_18,(char *)this,__oflag);
  }
  return (SectionTracker *)local_18;
}

Assistant:

static SectionTracker& acquire( TrackerContext& ctx, std::string const& name ) {
            SectionTracker* section = CATCH_NULL;

            ITracker& currentTracker = ctx.currentTracker();
            if( ITracker* childTracker = currentTracker.findChild( name ) ) {
                section = dynamic_cast<SectionTracker*>( childTracker );
                assert( section );
            }
            else {
                section = new SectionTracker( name, ctx, &currentTracker );
                currentTracker.addChild( section );
            }
            if( !ctx.completedCycle() && !section->isComplete() ) {

                section->open();
            }
            return *section;
        }